

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void Js::JavascriptPromise::PerformPromiseThen
               (JavascriptPromise *sourcePromise,JavascriptPromiseCapability *capability,
               RecyclableObject *fulfillmentHandler,RecyclableObject *rejectionHandler,
               ScriptContext *scriptContext)

{
  code *pcVar1;
  PromiseStatus PVar2;
  bool bVar3;
  JavascriptPromiseReaction *pJVar4;
  SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount> *this;
  JavascriptLibrary *this_00;
  void **ppvVar5;
  Var pvVar6;
  undefined4 *puVar7;
  undefined1 local_50 [8];
  JavascriptPromiseReactionPair pair;
  JavascriptPromiseReaction *rejectReaction;
  JavascriptPromiseReaction *resolveReaction;
  ScriptContext *scriptContext_local;
  RecyclableObject *rejectionHandler_local;
  RecyclableObject *fulfillmentHandler_local;
  JavascriptPromiseCapability *capability_local;
  JavascriptPromise *sourcePromise_local;
  
  pJVar4 = JavascriptPromiseReaction::New(capability,fulfillmentHandler,scriptContext);
  pair.rejectReaction = JavascriptPromiseReaction::New(capability,rejectionHandler,scriptContext);
  PVar2 = GetStatus(sourcePromise);
  if (PVar2 == PromiseStatusCode_Unresolved) {
    pair.resolveReaction = pair.rejectReaction;
    local_50 = (undefined1  [8])pJVar4;
    this = Memory::
           WriteBarrierPtr<SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>_>::
           operator->(&sourcePromise->reactions);
    SList<Js::JavascriptPromiseReactionPair,_Memory::Recycler,_RealCount>::Prepend
              (this,(JavascriptPromiseReactionPair *)local_50);
  }
  else if (PVar2 == PromiseStatusCode_HasResolution) {
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&sourcePromise->result);
    pvVar6 = CrossSite::MarshalVar(scriptContext,*ppvVar5,false);
    EnqueuePromiseReactionTask(pJVar4,pvVar6,scriptContext);
  }
  else if (PVar2 == PromiseStatusCode_HasRejection) {
    bVar3 = GetIsHandled(sourcePromise);
    if (!bVar3) {
      this_00 = ScriptContext::GetLibrary(scriptContext);
      ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                          ((WriteBarrierPtr *)&sourcePromise->result);
      pvVar6 = CrossSite::MarshalVar(scriptContext,*ppvVar5,false);
      JavascriptLibrary::CallNativeHostPromiseRejectionTracker(this_00,sourcePromise,pvVar6,true);
    }
    pJVar4 = pair.rejectReaction;
    ppvVar5 = Memory::WriteBarrierPtr::operator_cast_to_void__
                        ((WriteBarrierPtr *)&sourcePromise->result);
    pvVar6 = CrossSite::MarshalVar(scriptContext,*ppvVar5,false);
    EnqueuePromiseReactionTask(pJVar4,pvVar6,scriptContext);
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x5dc,"(false)","Promise status is in an invalid state");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  SetIsHandled(sourcePromise);
  return;
}

Assistant:

void JavascriptPromise::PerformPromiseThen(
        JavascriptPromise* sourcePromise,
        JavascriptPromiseCapability* capability,
        RecyclableObject* fulfillmentHandler,
        RecyclableObject* rejectionHandler,
        ScriptContext* scriptContext)
    {
        auto* resolveReaction = JavascriptPromiseReaction::New(capability, fulfillmentHandler, scriptContext);
        auto* rejectReaction = JavascriptPromiseReaction::New(capability, rejectionHandler, scriptContext);

        switch (sourcePromise->GetStatus())
        {
        case PromiseStatusCode_Unresolved:
            JavascriptPromiseReactionPair pair;
            pair.resolveReaction = resolveReaction;
            pair.rejectReaction = rejectReaction;
            sourcePromise->reactions->Prepend(pair);
            break;

        case PromiseStatusCode_HasResolution:
            EnqueuePromiseReactionTask(
                resolveReaction, 
                CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                scriptContext);
            break;

        case PromiseStatusCode_HasRejection:
        {
            if (!sourcePromise->GetIsHandled())
            {
                scriptContext->GetLibrary()->CallNativeHostPromiseRejectionTracker(
                    sourcePromise,
                    CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                    true);
            }
            EnqueuePromiseReactionTask(
                rejectReaction,
                CrossSite::MarshalVar(scriptContext, sourcePromise->result),
                scriptContext);
            break;
        }

        default:
            AssertMsg(false, "Promise status is in an invalid state");
            break;
        }

        sourcePromise->SetIsHandled();
    }